

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O0

string * __thiscall
jbcoin::STArray::getText_abi_cxx11_(string *__return_storage_ptr__,STArray *this)

{
  bool bVar1;
  bool bVar2;
  string local_70 [32];
  reference local_50;
  STObject *o;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  bool first;
  allocator local_1a;
  undefined1 local_19;
  STArray *local_18;
  STArray *this_local;
  string *r;
  
  local_19 = 0;
  local_18 = this;
  this_local = (STArray *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  bVar1 = true;
  __end1 = std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::begin(&this->v_);
  o = (STObject *)std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::end(&this->v_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
                                     *)&o), bVar2) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
               ::operator*(&__end1);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
    }
    (*(local_50->super_STBase)._vptr_STBase[6])(local_70);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_70);
    std::__cxx11::string::~string(local_70);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_jbcoin::STObject_*,_std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string STArray::getText () const
{
    std::string r = "[";

    bool first = true;
    for (STObject const& o : v_)
    {
        if (!first)
            r += ",";

        r += o.getText ();
        first = false;
    }

    r += "]";
    return r;
}